

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elimination_ordering.cpp
# Opt level: O1

void indigox::algorithm::RandomOrder(PermutableGraph_p *G,ElimOrder *order)

{
  pointer *pppvVar1;
  pointer ppvVar2;
  element_type *peVar3;
  iterator __position;
  uint uVar4;
  ulong uVar5;
  size_t __i;
  long lVar6;
  AdjList *g;
  undefined8 *puVar7;
  mt19937 ran;
  random_device rd;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2728;
  random_device local_13a0;
  
  ppvVar2 = (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish != ppvVar2) {
    (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.super__Vector_impl_data.
    _M_finish = ppvVar2;
  }
  peVar3 = (((G->super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           super__PermGraph).graph_.
           super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  for (puVar7 = *(undefined8 **)
                 &((StoredVertexList *)((long)&peVar3->super_type + 0x18))->
                  super__List_base<void_*,_std::allocator<void_*>_>;
      (StoredVertexList *)puVar7 != (StoredVertexList *)((long)&peVar3->super_type + 0x18U);
      puVar7 = (undefined8 *)*puVar7) {
    __position._M_current =
         (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                ((vector<void*,std::allocator<void*>> *)order,__position,(void **)(puVar7 + 2));
    }
    else {
      *__position._M_current = (void *)puVar7[2];
      pppvVar1 = &(order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppvVar1 = *pppvVar1 + 1;
    }
  }
  std::random_device::random_device(&local_13a0);
  uVar4 = std::random_device::_M_getval();
  local_2728._M_x[0] = (unsigned_long)uVar4;
  lVar6 = 1;
  uVar5 = local_2728._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar6);
    local_2728._M_x[lVar6] = uVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  local_2728._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            ((__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
             super__Vector_impl_data._M_finish,&local_2728);
  std::random_device::_M_fini();
  return;
}

Assistant:

void RandomOrder(PermutableGraph_p G, ElimOrder& order) {
      order.clear();
      
      for (PermVertIterPair vs = G->GetVertices(); vs.first != vs.second; ++vs.first) {
        order.push_back(*vs.first);
      }
      
      std::random_device rd;
      std::mt19937 ran(rd());
      
      std::shuffle(order.begin(), order.end(), ran);
      
    }